

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<pstore::repo::container<unsigned_char>,void>
               (container<unsigned_char> *container,ostream *os)

{
  uchar *value;
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  
  std::operator<<(os,'{');
  puVar1 = container->begin_;
  puVar2 = container->end_;
  lVar3 = 0;
  do {
    value = puVar1 + lVar3;
    if (value == puVar2) {
      if (puVar2 != puVar1) {
LAB_001176be:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar3 != 0) && (std::operator<<(os,','), lVar3 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_001176be;
    }
    std::operator<<(os,' ');
    UniversalPrinter<unsigned_char>::Print(value,os);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }